

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

void __thiscall Minisat::OnlineProofChecker::detachClause(OnlineProofChecker *this,CRef cr)

{
  Lit p;
  vec<Minisat::Watcher> *idx;
  Watcher *t;
  CRef in_ESI;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *in_RDI;
  Clause *c;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CRef cr_00;
  Lit *in_stack_ffffffffffffff98;
  Watcher *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Watcher local_3c;
  int local_34;
  int local_30;
  int local_2c;
  Watcher local_28;
  int local_20;
  int local_1c;
  Clause *local_18;
  CRef local_c;
  
  local_c = in_ESI;
  local_18 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (Ref)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  local_20 = (int)Clause::operator[](local_18,0);
  local_1c = (int)operator~((Lit)local_20);
  idx = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
                  (in_RDI,in_stack_ffffffffffffff98);
  cr_00 = local_c;
  local_2c = (int)Clause::operator[](local_18,1);
  Watcher::Watcher(&local_28,cr_00,(Lit)local_2c);
  removeUnSort<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
            ((vec<Minisat::Watcher> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  t = (Watcher *)(in_RDI + 0x58);
  local_34 = (int)Clause::operator[](local_18,1);
  local_30 = (int)operator~((Lit)local_34);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
            (in_RDI,(Lit *)idx);
  p = Clause::operator[](local_18,0);
  Watcher::Watcher(&local_3c,local_c,p);
  removeUnSort<Minisat::vec<Minisat::Watcher>,Minisat::Watcher>
            ((vec<Minisat::Watcher> *)CONCAT44(local_c,in_stack_ffffffffffffffb0),t);
  return;
}

Assistant:

inline void OnlineProofChecker::detachClause(CRef cr)
{
    const Clause &c = ca[cr];
    removeUnSort(watches[~c[0]], Watcher(cr, c[1]));
    removeUnSort(watches[~c[1]], Watcher(cr, c[0]));
}